

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_do_more(connectdata *conn,_Bool *completed)

{
  CURLcode local_1c;
  CURLcode result;
  _Bool *completed_local;
  connectdata *conn_local;
  
  local_1c = CURLE_OK;
  *completed = false;
  if (conn->handler->do_more != (Curl_do_more_func)0x0) {
    local_1c = (*conn->handler->do_more)(conn,completed);
  }
  if ((local_1c == CURLE_OK) && ((*completed & 1U) != 0)) {
    do_complete(conn);
  }
  return local_1c;
}

Assistant:

CURLcode Curl_do_more(struct connectdata *conn, bool *completed)
{
  CURLcode result=CURLE_OK;

  *completed = FALSE;

  if(conn->handler->do_more)
    result = conn->handler->do_more(conn, completed);

  if(!result && *completed)
    /* do_complete must be called after the protocol-specific DO function */
    do_complete(conn);

  return result;
}